

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JaegerPropagator.h
# Opt level: O1

StrMap * jaegertracing::propagation::
         JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
         ::parseCommaSeparatedMap(StrMap *__return_storage_ptr__,string *escapedValue)

{
  istream *piVar1;
  long lVar2;
  mapped_type *pmVar3;
  string piece;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  istringstream iss;
  string local_210;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  key_type local_1d0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  net::URI::queryUnescape(&local_210,escapedValue);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_210,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_210,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    lVar2 = std::__cxx11::string::find((char)&local_210,0x3d);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&local_210);
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)&local_210);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)__return_storage_ptr__,&local_1d0);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static StrMap parseCommaSeparatedMap(const std::string& escapedValue)
    {
        StrMap map;
        std::istringstream iss(net::URI::queryUnescape(escapedValue));
        std::string piece;
        while (std::getline(iss, piece, ',')) {
            const auto eqPos = piece.find('=');
            if (eqPos != std::string::npos) {
                const auto key = piece.substr(0, eqPos);
                const auto value = piece.substr(eqPos + 1);
                map[key] = value;
            }
        }
        return map;
    }